

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O1

void Am_Choice_Stop_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  int iVar1;
  int iVar2;
  Am_Input_Char ic;
  Am_Value *pAVar3;
  Am_Object command_obj;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Inter_Location local_58;
  Am_Object local_50;
  Am_Inter_Internal_Method inter_method;
  
  inter_method.from_wrapper = (Am_Method_Wrapper *)0x0;
  inter_method.Call = (Am_Inter_Internal_Method_Type *)0x0;
  pAVar3 = Am_Object::Get(&Am_Interactor,0xc2,0);
  Am_Inter_Internal_Method::operator=(&inter_method,pAVar3);
  (*inter_method.Call)(inter,object,event_window,ev);
  command_obj.data = (Am_Object_Data *)0x0;
  pAVar3 = Am_Object::Get(inter,0xc5,0);
  Am_Object::operator=(&command_obj,pAVar3);
  Am_Object::Am_Object(&local_60,&command_obj);
  Am_Object::Am_Object(&local_68,object);
  Am_Object::Am_Object(&local_70,inter);
  iVar1 = ev->x;
  iVar2 = ev->y;
  Am_Object::Am_Object(&local_78,event_window);
  Choice_Handle_New_Old(&local_60,&local_68,&local_70,iVar1,iVar2,&local_78,ev->input_char);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::Am_Object(&local_80,inter);
  Am_Object::Am_Object(&local_88,&command_obj);
  iVar1 = ev->x;
  iVar2 = ev->y;
  Am_Object::Am_Object(&local_90,event_window);
  ic = ev->input_char;
  Am_Object::Am_Object(&local_50,object);
  Am_Inter_Location::Am_Inter_Location(&local_58,&Am_No_Location);
  Am_Call_Final_Do_And_Register
            (&local_80,&local_88,iVar1,iVar2,&local_90,ic,(Am_Object_Data *)&local_50,
             (Am_Inter_Location_Data *)&local_58,choice_set_impl_command);
  Am_Inter_Location::~Am_Inter_Location(&local_58);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&command_obj);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Choice_Stop_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  Am_INTER_TRACE_PRINT(inter, "Choice stopping over " << object);

  // First, call the prototype's method.  This is first so the
  // interactor is sure not to be running if the command's do
  // method calls pop-up or something and thus doesn't exit right away.
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_STOP_METHOD);
  inter_method.Call(inter, object, event_window, ev);

  Am_Object command_obj;
  command_obj = inter.Get(Am_COMMAND);
  Choice_Handle_New_Old(command_obj, object, inter, ev->x, ev->y, event_window,
                        ev->input_char);
  Am_Call_Final_Do_And_Register(inter, command_obj, ev->x, ev->y, event_window,
                                ev->input_char, object, Am_No_Location,
                                choice_set_impl_command);
}